

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::PicturedInputBufferHash(Forth *this)

{
  uint valueLo;
  uint valueHi;
  Cell CVar1;
  const_reference pvVar2;
  anon_union_8_4_a234c5df_for_data_ local_88;
  DCell d2;
  string local_78;
  allocator<char> local_41;
  string local_40;
  anon_union_8_4_a234c5df_for_data_ local_20;
  DCell base;
  DCell d1;
  Forth *this_local;
  
  requireDStackDepth(this,2,"#");
  valueLo = ForthStack<unsigned_int>::getTop(&this->dStack,1);
  valueHi = ForthStack<unsigned_int>::getTop(&this->dStack,0);
  DCell::DCell(&base,valueLo,valueHi);
  CVar1 = getNumericBase(this);
  DCell::DCell((DCell *)&local_20.Cells,(ulong)CVar1);
  if (local_20.Dcells == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"#: zero numeric base",&local_41);
    throwCppExceptionMessage(this,&local_40,errorUnsupportedOperation);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  if (0x24 < local_20.Dcells) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"#: numeric base > 36",(allocator<char> *)((long)&d2.data_ + 7));
    throwCppExceptionMessage(this,&local_78,errorUnsupportedOperation);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)((long)&d2.data_ + 7));
  }
  pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      digitsCodes_abi_cxx11_,(ulong)base.data_ % local_20.Dcells);
  d2.data_.SCells.hi._2_1_ = *pvVar2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->picturedInputBuffer,(value_type_conflict2 *)((long)&d2.data_.Cells.hi + 2));
  DCell::DCell((DCell *)&local_88.Cells,(ulong)base.data_ / local_20.Dcells);
  ForthStack<unsigned_int>::setTop(&this->dStack,1,local_88.Cells.lo);
  ForthStack<unsigned_int>::setTop(&this->dStack,0,local_88.Cells.hi);
  return;
}

Assistant:

void PicturedInputBufferHash(){
			REQUIRE_DSTACK_DEPTH(2, "#");
			DCell d1(dStack.getTop(1),dStack.getTop(0));
			DCell base( getNumericBase() );
			RUNTIME_ERROR_IF(base.data_.Dcells == 0, "#: zero numeric base", errorUnsupportedOperation);
			RUNTIME_ERROR_IF(base.data_.Dcells > 36, "#: numeric base > 36", errorUnsupportedOperation);
			picturedInputBuffer.push_back(static_cast<Char>(digitsCodes.at(d1.data_.Dcells % base.data_.Dcells)));
			DCell d2( d1.data_.Dcells / base.data_.Dcells );
			dStack.setTop(1, d2.data_.Cells.lo);
			dStack.setTop(0, d2.data_.Cells.hi);
		}